

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O0

BitArray * ZXing::Aztec::HighLevelEncoder::Encode(string *text)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  iterator iVar4;
  iterator iVar5;
  ulong in_RSI;
  BitArray *in_RDI;
  EncodingState minState;
  int nextChar;
  int pairCode;
  int index;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> states;
  EncodingState *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  EncodingState *this;
  value_type *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar6;
  int in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
  *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff40;
  EncodingState *in_stack_ffffffffffffff48;
  int local_6c;
  int local_68;
  EncodingState local_28;
  
  local_28._24_8_ = in_RSI;
  std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
  list((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)0x264616);
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)0x26463f);
  std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
  push_back((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)
            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8)
  ;
  EncodingState::~EncodingState((EncodingState *)0x26467e);
  for (local_68 = 0; iVar1 = Size<std::__cxx11::string>(in_stack_fffffffffffffed0), local_68 < iVar1
      ; local_68 = local_68 + 1) {
    iVar1 = Size<std::__cxx11::string>(in_stack_fffffffffffffed0);
    if (local_68 + 1 < iVar1) {
      pcVar3 = (char *)std::__cxx11::string::operator[](local_28._24_8_);
      iVar1 = (int)*pcVar3;
    }
    else {
      iVar1 = 0;
    }
    iVar6 = iVar1;
    pcVar3 = (char *)std::__cxx11::string::operator[](local_28._24_8_);
    iVar2 = (int)*pcVar3;
    if (iVar2 == 0xd) {
      local_6c = 0;
      if (iVar1 == 10) {
        local_6c = 2;
      }
    }
    else if (iVar2 == 0x2c) {
      local_6c = 0;
      if (iVar1 == 0x20) {
        local_6c = 4;
      }
    }
    else if (iVar2 == 0x2e) {
      local_6c = 0;
      if (iVar1 == 0x20) {
        local_6c = 3;
      }
    }
    else if (iVar2 == 0x3a) {
      local_6c = 0;
      if (iVar1 == 0x20) {
        local_6c = 5;
      }
    }
    else {
      local_6c = 0;
    }
    if (local_6c == 0) {
      UpdateStateListForChar
                (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
      ::operator=((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
                  )CONCAT44(iVar6,iVar2),
                  (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
                  )in_stack_fffffffffffffed8);
      std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
      ::~list((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)
              0x2648d2);
    }
    else {
      UpdateStateListForPair
                (in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                 (int)in_stack_ffffffffffffff20);
      std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
      ::operator=((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
                  )CONCAT44(iVar6,iVar2),
                  (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *
                  )in_stack_fffffffffffffed8);
      std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
      ::~list((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)
              0x264877);
      local_68 = local_68 + 1;
    }
  }
  this = &local_28;
  iVar4 = std::__cxx11::
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::begin
                    ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)in_stack_fffffffffffffec8);
  iVar5 = std::__cxx11::
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::end
                    ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)in_stack_fffffffffffffec8);
  std::
  min_element<std::_List_iterator<ZXing::Aztec::EncodingState>,ZXing::Aztec::HighLevelEncoder::Encode(std::__cxx11::string_const&)::__0>
            (iVar4._M_node,iVar5._M_node);
  std::_List_iterator<ZXing::Aztec::EncodingState>::operator*
            ((_List_iterator<ZXing::Aztec::EncodingState> *)0x26493a);
  EncodingState::EncodingState(this,in_stack_fffffffffffffec8);
  ToBitArray(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  EncodingState::~EncodingState((EncodingState *)0x26496c);
  std::__cxx11::list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
  ~list((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> *)0x264979)
  ;
  return in_RDI;
}

Assistant:

BitArray
HighLevelEncoder::Encode(const std::string& text)
{
	std::list<EncodingState> states;
	states.push_back(EncodingState{ std::vector<Token>(), MODE_UPPER, 0, 0 });
	for (int index = 0; index < Size(text); index++) {
		int pairCode;
		int nextChar = index + 1 < Size(text) ? text[index + 1] : 0;
		switch (text[index]) {
		case '\r': pairCode = nextChar == '\n' ? 2 : 0; break;
		case '.': pairCode = nextChar == ' ' ? 3 : 0; break;
		case ',': pairCode = nextChar == ' ' ? 4 : 0; break;
		case ':': pairCode = nextChar == ' ' ? 5 : 0; break;
		default: pairCode = 0;
		}
		if (pairCode > 0) {
			// We have one of the four special PUNCT pairs.  Treat them specially.
			// Get a new set of states for the two new characters.
			states = UpdateStateListForPair(states, index, pairCode);
			index++;
		} else {
			// Get a new set of states for the new character.
			states = UpdateStateListForChar(states, text, index);
		}
	}
	// We are left with a set of states.  Find the shortest one.
	EncodingState minState = *std::min_element(states.begin(), states.end(), [](const EncodingState& a, const EncodingState& b) { return a.bitCount < b.bitCount; });
	// Convert it to a bit array, and return.
	return ToBitArray(minState, text);
}